

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightBounds * __thiscall pbrt::ProjectionLight::Bounds(ProjectionLight *this)

{
  initializer_list<float> __l;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  int iVar1;
  Vector3<float> *v_00;
  long in_RSI;
  LightBounds *in_RDI;
  Image *this_00;
  float fVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Vector3<float> VVar8;
  Point3<float> *in_stack_00000038;
  Transform *in_stack_00000040;
  Vector3f w;
  Point3f p;
  Float phi;
  int u;
  int v;
  Float sum;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  Point2<int> *in_stack_fffffffffffffe90;
  WrapMode in_stack_fffffffffffffe9c;
  WrapMode2D *in_stack_fffffffffffffea0;
  undefined1 *puVar9;
  Float in_stack_fffffffffffffea8;
  Float phi_00;
  Point3f *p_00;
  undefined4 in_stack_fffffffffffffec0;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  WrapMode in_stack_ffffffffffffff14;
  WrapMode in_stack_ffffffffffffff18;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff1c;
  Point3f local_dc;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c4;
  float local_bc;
  undefined8 local_b8;
  float local_b0;
  undefined1 local_a4 [12];
  undefined8 local_98;
  float local_90;
  Tuple2<pbrt::Point2,_int> local_88;
  Tuple2<pbrt::Point2,_int> local_80;
  float local_78;
  Vector3<float> *in_stack_ffffffffffffff98;
  Transform *in_stack_ffffffffffffffa0;
  Float local_44;
  Float local_40;
  Float local_3c;
  Float *local_38;
  undefined8 local_30;
  Tuple2<pbrt::Point2,_int> local_24;
  int local_1c;
  Tuple2<pbrt::Point2,_int> local_18;
  int local_10;
  float local_c;
  undefined1 auVar6 [56];
  
  local_c = 0.0;
  local_10 = 0;
  while( true ) {
    iVar1 = local_10;
    local_18 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RSI + 0x98));
    if (local_18.y <= iVar1) break;
    local_1c = 0;
    while( true ) {
      iVar1 = local_1c;
      local_24 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RSI + 0x98));
      if (local_24.x <= iVar1) break;
      Point2<int>::Point2(in_stack_fffffffffffffe90,(int)in_stack_fffffffffffffe8c,
                          (int)in_stack_fffffffffffffe88);
      WrapMode2D::WrapMode2D(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      wrapMode.wrap.values[1] = in_stack_ffffffffffffff18;
      wrapMode.wrap.values[0] = in_stack_ffffffffffffff14;
      local_44 = Image::GetChannel((Image *)CONCAT44(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08),
                                   (Point2i)in_stack_ffffffffffffff1c,
                                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),wrapMode);
      Point2<int>::Point2(in_stack_fffffffffffffe90,(int)in_stack_fffffffffffffe8c,
                          (int)in_stack_fffffffffffffe88);
      WrapMode2D::WrapMode2D(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      wrapMode_00.wrap.values[1] = in_stack_ffffffffffffff18;
      wrapMode_00.wrap.values[0] = in_stack_ffffffffffffff14;
      local_40 = Image::GetChannel((Image *)CONCAT44(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08),
                                   (Point2i)in_stack_ffffffffffffff1c,
                                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),wrapMode_00);
      Point2<int>::Point2(in_stack_fffffffffffffe90,(int)in_stack_fffffffffffffe8c,
                          (int)in_stack_fffffffffffffe88);
      WrapMode2D::WrapMode2D(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      wrapMode_01.wrap.values[1] = in_stack_ffffffffffffff18;
      wrapMode_01.wrap.values[0] = in_stack_ffffffffffffff14;
      local_3c = Image::GetChannel((Image *)CONCAT44(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08),
                                   (Point2i)in_stack_ffffffffffffff1c,
                                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),wrapMode_01);
      local_38 = &local_44;
      local_30 = 3;
      __l._M_array._4_4_ = in_stack_fffffffffffffe8c;
      __l._M_array._0_4_ = in_stack_fffffffffffffe88;
      __l._M_len = (size_type)in_stack_fffffffffffffe90;
      fVar2 = std::max<float>(__l);
      local_c = fVar2 + local_c;
      local_1c = local_1c + 1;
    }
    local_10 = local_10 + 1;
  }
  fVar2 = *(float *)(in_RSI + 0x1b8) * local_c;
  this_00 = (Image *)(in_RSI + 0x98);
  local_80 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(this_00);
  iVar1 = local_80.x;
  local_88 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(this_00);
  local_78 = fVar2 / (float)(iVar1 * local_88.y);
  v_00 = (Vector3<float> *)(in_RSI + 0x18);
  puVar9 = local_a4;
  phi_00 = 0.0;
  auVar6 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  Point3<float>::Point3
            ((Point3<float> *)this_00,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0.0);
  PVar7 = Transform::operator()(in_stack_00000040,in_stack_00000038);
  local_b0 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  local_b8 = vmovlpd_avx(auVar3._0_16_);
  p_00 = &local_dc;
  auVar6 = ZEXT856(0);
  local_98 = local_b8;
  local_90 = local_b0;
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0.0);
  VVar8 = Transform::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_c8 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_d0 = vmovlpd_avx(auVar4._0_16_);
  VVar8 = Normalize<float>(v_00);
  local_bc = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_c4 = vmovlpd_avx(auVar5._0_16_);
  fVar2 = local_78;
  std::acos((double)(ulong)*(uint *)(in_RSI + 0x2d4));
  LightBounds::LightBounds
            ((LightBounds *)CONCAT44(fVar2,in_stack_fffffffffffffec0),p_00,v_00,phi_00,
             in_stack_fffffffffffffea8,(Float)((ulong)puVar9 >> 0x20),SUB81((ulong)puVar9 >> 0x18,0)
            );
  return in_RDI;
}

Assistant:

LightBounds ProjectionLight::Bounds() const {
#if 0
    // Along the lines of Phi()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp({(u + .5f) / image.Resolution().x,
                                            (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);
            sum += image.GetChannels({u, v}, rgbChannelDesc).MaxValue() * dwdA;
        }
    Float phi = scale * A * sum / (image.Resolution().x * image.Resolution().y);
#else
    // See comment in SpotLight::Bounds()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u)
            sum += std::max({image.GetChannel({u, v}, 0), image.GetChannel({u, v}, 1),
                             image.GetChannel({u, v}, 2)});
    Float phi = scale * sum / (image.Resolution().x * image.Resolution().y);
#endif
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    return LightBounds(p, w, phi, 0.f, std::acos(cosTotalWidth), false);
}